

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus assessLp(HighsLp *lp,HighsOptions *options)

{
  bool bVar1;
  HighsStatus HVar2;
  size_type sVar3;
  undefined8 uVar4;
  HighsSparseMatrix *in_RSI;
  int *in_RDI;
  HighsInt lp_num_nz;
  HighsIndexCollection index_collection_1;
  HighsIndexCollection index_collection;
  HighsStatus call_status;
  HighsStatus return_status;
  HighsSparseMatrix *in_stack_fffffffffffffb08;
  HighsLogOptions *in_stack_fffffffffffffb10;
  HighsLp *in_stack_fffffffffffffb18;
  double in_stack_fffffffffffffb20;
  HighsSparseMatrix *pHVar5;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  HighsStatus HVar6;
  undefined4 in_stack_fffffffffffffb34;
  HighsStatus HVar7;
  HighsIndexCollection *in_stack_fffffffffffffb38;
  allocator *paVar8;
  HighsInt in_stack_fffffffffffffb44;
  HighsOptions *in_stack_fffffffffffffb48;
  HighsStatus status;
  string *in_stack_fffffffffffffb50;
  undefined8 in_stack_fffffffffffffb58;
  allocator *paVar9;
  undefined4 in_stack_fffffffffffffb60;
  HighsStatus in_stack_fffffffffffffb64;
  HighsStatus in_stack_fffffffffffffb88;
  HighsStatus in_stack_fffffffffffffb8c;
  allocator *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  HighsStatus in_stack_fffffffffffffb9c;
  HighsSparseMatrix *in_stack_fffffffffffffba0;
  HighsSparseMatrix *in_stack_fffffffffffffba8;
  int *in_stack_fffffffffffffbb0;
  HighsOptions *in_stack_fffffffffffffbb8;
  HighsStatus in_stack_fffffffffffffbd0;
  HighsStatus in_stack_fffffffffffffbd4;
  string local_3e8 [32];
  int local_3c8;
  allocator local_3c1;
  string local_3c0 [135];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [8];
  HighsLogOptions *in_stack_fffffffffffffcf8;
  HighsLp *in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  allocator local_239;
  string local_238 [128];
  uint local_1b8;
  allocator local_1b1;
  string local_1b0 [128];
  int local_130;
  undefined1 local_12c;
  undefined4 local_128;
  int local_124;
  allocator local_d9;
  string local_d8 [151];
  allocator local_41;
  string local_40 [32];
  HighsStatus local_20;
  HighsStatus local_1c;
  HighsSparseMatrix *local_18;
  int *local_10;
  HighsStatus local_4;
  
  local_1c = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"assessLp",&local_41);
  bVar1 = lpDimensionsOk(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                         in_stack_fffffffffffffcf8);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = (uint)bVar1 + kError;
  HighsLogOptions::HighsLogOptions
            (in_stack_fffffffffffffb10,(HighsLogOptions *)in_stack_fffffffffffffb08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"assessLpDimensions",&local_d9);
  local_1c = interpretCallStatus((HighsLogOptions *)
                                 CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                 (HighsStatus)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                                 (HighsStatus)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4f52ec);
  if (local_1c == kError) {
    local_4 = local_1c;
  }
  else {
    if (*local_10 != 0) {
      HighsIndexCollection::HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffb10);
      local_130 = *local_10;
      local_12c = 1;
      local_128 = 0;
      local_124 = *local_10 + -1;
      local_20 = assessCosts(in_stack_fffffffffffffb48,in_stack_fffffffffffffb44,
                             in_stack_fffffffffffffb38,
                             (vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                             (bool *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                             in_stack_fffffffffffffb20);
      HighsLogOptions::HighsLogOptions
                (in_stack_fffffffffffffb10,(HighsLogOptions *)in_stack_fffffffffffffb08);
      in_stack_fffffffffffffbd0 = local_20;
      in_stack_fffffffffffffbd4 = local_1c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b0,"assessCosts",&local_1b1);
      local_1c = interpretCallStatus((HighsLogOptions *)
                                     CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                     (HighsStatus)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                                     (HighsStatus)in_stack_fffffffffffffb58,
                                     in_stack_fffffffffffffb50);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4f5523);
      if (local_1c == kError) {
        local_4 = local_1c;
        local_1b8 = 1;
      }
      else {
        in_stack_fffffffffffffbb0 = local_10 + 8;
        in_stack_fffffffffffffbb8 = (HighsOptions *)(local_10 + 0xe);
        in_stack_fffffffffffffba8 = local_18;
        bVar1 = HighsLp::isMip(in_stack_fffffffffffffb18);
        if (bVar1) {
          in_stack_fffffffffffffb08 =
               (HighsSparseMatrix *)
               std::vector<HighsVarType,_std::allocator<HighsVarType>_>::data
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x4f5634);
        }
        else {
          in_stack_fffffffffffffb08 = (HighsSparseMatrix *)0x0;
        }
        in_stack_fffffffffffffba0 = in_stack_fffffffffffffb08;
        in_stack_fffffffffffffb9c =
             assessBounds(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0,
                          (HighsInt)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                          (HighsIndexCollection *)in_stack_fffffffffffffb08,
                          (vector<double,_std::allocator<double>_> *)
                          CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                          (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90,
                          (double)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                          (HighsVarType *)
                          CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
        local_20 = in_stack_fffffffffffffb9c;
        HighsLogOptions::HighsLogOptions
                  (in_stack_fffffffffffffb10,(HighsLogOptions *)in_stack_fffffffffffffb08);
        in_stack_fffffffffffffb90 = &local_239;
        in_stack_fffffffffffffb88 = local_20;
        in_stack_fffffffffffffb8c = local_1c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_238,"assessBounds",in_stack_fffffffffffffb90);
        local_1c = interpretCallStatus((HighsLogOptions *)
                                       CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                                       ,(HighsStatus)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                                       (HighsStatus)in_stack_fffffffffffffb58,
                                       in_stack_fffffffffffffb50);
        std::__cxx11::string::~string(local_238);
        std::allocator<char>::~allocator((allocator<char> *)&local_239);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4f576e);
        if (local_1c == kError) {
          local_4 = local_1c;
          local_1b8 = 1;
        }
        else {
          local_1b8 = 0;
        }
      }
      HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffb10)
      ;
      if (local_1b8 != 0) {
        return local_4;
      }
    }
    if (local_10[1] != 0) {
      HighsIndexCollection::HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffb10);
      in_stack_fffffffffffffb08 = (HighsSparseMatrix *)0x0;
      local_20 = assessBounds(in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0,
                              (HighsInt)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                              (HighsIndexCollection *)in_stack_fffffffffffffba0,
                              (vector<double,_std::allocator<double>_> *)
                              CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                              (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffb90,
                              (double)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                              (HighsVarType *)
                              CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0));
      HighsLogOptions::HighsLogOptions
                (in_stack_fffffffffffffb10,(HighsLogOptions *)in_stack_fffffffffffffb08);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_310,"assessBounds",&local_311);
      in_stack_fffffffffffffb64 =
           interpretCallStatus((HighsLogOptions *)
                               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                               (HighsStatus)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                               (HighsStatus)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      local_1c = in_stack_fffffffffffffb64;
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4f5988);
      if (local_1c == kError) {
        local_4 = local_1c;
      }
      local_1b8 = (uint)(local_1c == kError);
      HighsIndexCollection::~HighsIndexCollection((HighsIndexCollection *)in_stack_fffffffffffffb10)
      ;
      if (local_1b8 != 0) {
        return local_4;
      }
    }
    if (*local_10 == 0) {
      local_4 = kOk;
    }
    else {
      status = (HighsStatus)((ulong)(local_10 + 0x20) >> 0x20);
      pHVar5 = local_18 + 8;
      paVar9 = &local_339;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_338,"LP",paVar9);
      local_20 = HighsSparseMatrix::assess
                           (in_stack_fffffffffffffba8,(HighsLogOptions *)in_stack_fffffffffffffba0,
                            (string *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                            (double)in_stack_fffffffffffffb90,
                            (double)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
      std::__cxx11::string::~string(local_338);
      std::allocator<char>::~allocator((allocator<char> *)&local_339);
      HighsLogOptions::HighsLogOptions
                (in_stack_fffffffffffffb10,(HighsLogOptions *)in_stack_fffffffffffffb08);
      paVar8 = &local_3c1;
      HVar6 = local_20;
      HVar7 = local_1c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3c0,"assessMatrix",paVar8);
      HVar2 = interpretCallStatus((HighsLogOptions *)
                                  CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                                  (HighsStatus)((ulong)paVar9 >> 0x20),(HighsStatus)paVar9,
                                  (string *)pHVar5);
      local_1c = HVar2;
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4f5bd4);
      if (local_1c == kError) {
        local_4 = local_1c;
      }
      else {
        local_3c8 = HighsSparseMatrix::numNz(in_stack_fffffffffffffb08);
        sVar3 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(local_10 + 0x30));
        if (local_3c8 < (int)sVar3) {
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(HVar7,HVar6),
                     CONCAT44(HVar2,in_stack_fffffffffffffb28));
        }
        sVar3 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(local_10 + 0x36));
        if (local_3c8 < (int)sVar3) {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)CONCAT44(HVar7,HVar6),
                     CONCAT44(HVar2,in_stack_fffffffffffffb28));
        }
        if (local_1c != kOk) {
          pHVar5 = local_18 + 8;
          highsStatusToString_abi_cxx11_(status);
          uVar4 = std::__cxx11::string::c_str();
          highsLogDev((HighsLogOptions *)pHVar5,kInfo,"assessLp returns HighsStatus = %s\n",uVar4);
          std::__cxx11::string::~string(local_3e8);
        }
        local_4 = local_1c;
      }
    }
  }
  return local_4;
}

Assistant:

HighsStatus assessLp(HighsLp& lp, const HighsOptions& options) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status = lpDimensionsOk("assessLp", lp, options.log_options)
                                ? HighsStatus::kOk
                                : HighsStatus::kError;
  return_status = interpretCallStatus(options.log_options, call_status,
                                      return_status, "assessLpDimensions");
  if (return_status == HighsStatus::kError) return return_status;

  if (lp.num_col_) {
    // Assess the LP column costs
    HighsIndexCollection index_collection;
    index_collection.dimension_ = lp.num_col_;
    index_collection.is_interval_ = true;
    index_collection.from_ = 0;
    index_collection.to_ = lp.num_col_ - 1;
    call_status = assessCosts(options, 0, index_collection, lp.col_cost_,
                              lp.has_infinite_cost_, options.infinite_cost);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessCosts");
    if (return_status == HighsStatus::kError) return return_status;
    // Assess the LP column bounds
    call_status = assessBounds(
        options, "Col", 0, index_collection, lp.col_lower_, lp.col_upper_,
        options.infinite_bound, lp.isMip() ? lp.integrality_.data() : nullptr);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessBounds");
    if (return_status == HighsStatus::kError) return return_status;
  }
  if (lp.num_row_) {
    // Assess the LP row bounds
    HighsIndexCollection index_collection;
    index_collection.dimension_ = lp.num_row_;
    index_collection.is_interval_ = true;
    index_collection.from_ = 0;
    index_collection.to_ = lp.num_row_ - 1;
    call_status =
        assessBounds(options, "Row", 0, index_collection, lp.row_lower_,
                     lp.row_upper_, options.infinite_bound);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessBounds");
    if (return_status == HighsStatus::kError) return return_status;
  }
  // If the LP has no columns the matrix must be empty and there is
  // nothing left to test
  if (lp.num_col_ == 0) {
    assert(!lp.a_matrix_.numNz());
    return HighsStatus::kOk;
  }
  // From here, any LP has lp.num_col_ > 0 and lp.a_matrix_.start_[lp.num_col_]
  // exists (as the number of nonzeros)
  assert(lp.num_col_ > 0);

  // Assess the LP matrix - even if there are no rows!
  call_status =
      lp.a_matrix_.assess(options.log_options, "LP", options.small_matrix_value,
                          options.large_matrix_value);
  return_status = interpretCallStatus(options.log_options, call_status,
                                      return_status, "assessMatrix");
  if (return_status == HighsStatus::kError) return return_status;
  // If entries have been removed from the matrix, resize the index
  // and value vectors to prevent bug in presolve
  HighsInt lp_num_nz = lp.a_matrix_.numNz();
  if ((HighsInt)lp.a_matrix_.index_.size() > lp_num_nz)
    lp.a_matrix_.index_.resize(lp_num_nz);
  if ((HighsInt)lp.a_matrix_.value_.size() > lp_num_nz)
    lp.a_matrix_.value_.resize(lp_num_nz);
  if (return_status != HighsStatus::kOk)
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "assessLp returns HighsStatus = %s\n",
                highsStatusToString(return_status).c_str());
  return return_status;
}